

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BrepTrim * __thiscall ON_Brep::NewTrim(ON_Brep *this,int c2i)

{
  int iVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  ON_Curve *local_70;
  ON_BoundingBox local_58;
  ON_Curve *local_28;
  ON_Curve *c2;
  ON_BrepTrim *trim;
  int ti;
  int c2i_local;
  ON_Brep *this_local;
  
  this->m_is_solid = 0;
  trim._4_4_ = c2i;
  _ti = this;
  trim._0_4_ = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  c2 = (ON_Curve *)ON_ClassArray<ON_BrepTrim>::AppendNew((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  iVar1 = trim._4_4_;
  ((ON_BrepTrim *)c2)->m_brep = this;
  ((ON_BrepTrim *)c2)->m_trim_index = (int)trim;
  ((ON_BrepTrim *)c2)->m_ei = -1;
  ((ON_BrepTrim *)c2)->m_type = unknown;
  ((ON_BrepTrim *)c2)->m_bRev3d = false;
  ((ON_BrepTrim *)c2)->m_c2i = trim._4_4_;
  ((ON_BrepTrim *)c2)->m_iso = not_iso;
  ((ON_BrepTrim *)c2)->m_li = -1;
  ((ON_BrepTrim *)c2)->m_tolerance[0] = -1.23432101234321e+308;
  ((ON_BrepTrim *)c2)->m_tolerance[1] = -1.23432101234321e+308;
  ((ON_BrepTrim *)c2)->m__legacy_2d_tol = -1.23432101234321e+308;
  ((ON_BrepTrim *)c2)->m__legacy_3d_tol = -1.23432101234321e+308;
  ((ON_BrepTrim *)c2)->m__legacy_flags = 0;
  if (-1 < trim._4_4_) {
    iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
    if (iVar1 < iVar2) {
      ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,trim._4_4_);
      local_70 = *ppOVar3;
      goto LAB_00528826;
    }
  }
  local_70 = (ON_Curve *)0x0;
LAB_00528826:
  local_28 = local_70;
  if (local_70 != (ON_Curve *)0x0) {
    ON_CurveProxy::SetProxyCurve((ON_CurveProxy *)c2,local_70);
    ON_Geometry::BoundingBox(&local_58,&local_28->super_ON_Geometry);
    memcpy(&c2[9].super_ON_Geometry.super_ON_Object.m_userdata_list,&local_58,0x30);
    c2[10].super_ON_Geometry.super_ON_Object.m_userdata_list = (ON_UserData *)0x0;
    c2[0xc].super_ON_Geometry.super_ON_Object._vptr_ON_Object = (_func_int **)0x0;
  }
  return (ON_BrepTrim *)c2;
}

Assistant:

ON_BrepTrim& 
ON_Brep::NewTrim( int c2i )
{
  m_is_solid = 0;
  int ti = m_T.Count();
  ON_BrepTrim& trim = m_T.AppendNew();
  trim.m_brep = this;
  trim.m_trim_index = ti;
  trim.m_ei = -1;
  trim.m_type = ON_BrepTrim::unknown;
  trim.m_bRev3d = false;
  trim.m_c2i = c2i;
  trim.m_iso = ON_Surface::not_iso;
  trim.m_li = -1;
  trim.m_tolerance[0] = ON_UNSET_VALUE;
  trim.m_tolerance[1] = ON_UNSET_VALUE;
  trim.m__legacy_2d_tol = ON_UNSET_VALUE;
  trim.m__legacy_3d_tol = ON_UNSET_VALUE;
  trim.m__legacy_flags = 0;
  const ON_Curve* c2 = (c2i >= 0 && c2i < m_C2.Count()) 
                     ? m_C2[c2i] 
                     : 0;
  if ( c2 ) 
  {
    trim.SetProxyCurve( c2 );
    trim.m_pbox = c2->BoundingBox();
    trim.m_pbox.m_min.z = 0.0;
    trim.m_pbox.m_max.z = 0.0;
  }

  return trim;
}